

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

CommandInfo * findCommandByName(String *fname)

{
  bool bVar1;
  reference ppCVar2;
  String local_a8;
  String local_88;
  CommandInfo *local_68;
  CommandInfo *comm;
  Iterator __end1;
  Iterator __begin1;
  List<CommandInfo_*> *__range1;
  String *fname_local;
  
  List<CommandInfo_*>::begin((Iterator *)&__end1._M_node,&Commands);
  List<CommandInfo_*>::end((Iterator *)&comm,&Commands);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&comm);
    if (!bVar1) {
      return (CommandInfo *)0x0;
    }
    ppCVar2 = std::_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**>::operator*
                        ((_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**> *)
                         &__end1._M_node);
    local_68 = *ppCVar2;
    String::toUppercase(&local_88,fname);
    String::toUppercase(&local_a8,&local_68->name);
    bVar1 = String::operator==(&local_88,&local_a8);
    String::~String(&local_a8);
    String::~String(&local_88);
    if (bVar1) break;
    std::_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**>::operator++
              ((_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**> *)&__end1._M_node);
  }
  return local_68;
}

Assistant:

CommandInfo* findCommandByName (String fname)
{
	for (CommandInfo* comm : Commands)
	{
		if (fname.toUppercase() == comm->name.toUppercase())
			return comm;
	}

	return null;
}